

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O3

void write_v7m_exception_arm(CPUARMState *env,uint32_t new_exc)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  
  if ((env->v7m).exception == 0) {
    uVar1 = (env->v7m).secure;
    uVar2 = (env->v7m).control[uVar1];
    (env->v7m).exception = new_exc;
    if (new_exc == 0) {
      if ((byte)((uVar2 & 2) >> 1) != ((byte)(env->v7m).control[uVar1] & 2) >> 1) goto LAB_00591365;
    }
    else if ((uVar2 & 2) != 0) {
LAB_00591365:
      uVar3 = (env->v7m).other_sp;
      (env->v7m).other_sp = env->regs[0xd];
      env->regs[0xd] = uVar3;
      return;
    }
  }
  else {
    (env->v7m).exception = new_exc;
    if ((new_exc == 0) && (((env->v7m).control[(env->v7m).secure] & 2) != 0)) goto LAB_00591365;
  }
  return;
}

Assistant:

static inline bool arm_v7m_is_handler_mode(CPUARMState *env)
{
    return env->v7m.exception != 0;
}